

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O3

void __thiscall
HBT_correlation::HBT_correlation
          (HBT_correlation *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  pointer pcVar4;
  iterator iVar5;
  iterator iVar6;
  unsigned_long_long **ppuVar7;
  unsigned_long_long **ppuVar8;
  unsigned_long_long *puVar9;
  unsigned_long_long *puVar10;
  double **ppdVar11;
  double **ppdVar12;
  double **ppdVar13;
  double **ppdVar14;
  double *pdVar15;
  double *pdVar16;
  double *pdVar17;
  double *pdVar18;
  double **ppdVar19;
  double **ppdVar20;
  double *pdVar21;
  double *pdVar22;
  vector<double,_std::allocator<double>_> *pvVar23;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_00;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this_01;
  vector<double,_std::allocator<double>_> *this_02;
  vector<double,_std::allocator<double>_> *this_03;
  int iVar24;
  int iVar25;
  int k_1;
  long lVar26;
  int k;
  ulong uVar27;
  ulong uVar28;
  int j_1;
  ulong uVar29;
  int j;
  ulong uVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  double local_278;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_270;
  double local_268;
  vector<double,_std::allocator<double>_> *local_260;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_258;
  double *****local_250;
  vector<double,_std::allocator<double>_> *local_248;
  double ******local_240;
  double ******local_238;
  double ******local_230;
  double ******local_228;
  double ******local_220;
  double ******local_218;
  vector<double,_std::allocator<double>_> *local_210;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_208;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_200;
  vector<double,_std::allocator<double>_> *local_1f8;
  vector<double,_std::allocator<double>_> *local_1f0;
  pretty_ostream *local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  string *local_1d8;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)this,&paraRdr->names);
  std::vector<double,_std::allocator<double>_>::vector(&(this->paraRdr_).values,&paraRdr->values);
  paVar1 = &(this->path_).field_2;
  (this->path_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (path->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->path_,pcVar4,pcVar4 + path->_M_string_length);
  (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->particle_list).super___shared_ptr<particleSamples,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1e0 = paVar1;
  local_1d8 = &this->path_;
  pretty_ostream::pretty_ostream(&this->messager);
  local_248 = &this->KT_array_;
  local_210 = &this->Kphi_array_;
  local_1f0 = &this->q_out;
  local_1f8 = &this->q_side;
  local_260 = &this->q_long;
  local_200 = &this->number_of_pairs_numerator_KTdiff;
  local_208 = &this->number_of_pairs_denormenator_KTdiff;
  local_270 = &this->number_of_pairs_numerator_KTdiff_qinv_;
  local_258 = &this->number_of_pairs_denormenator_KTdiff_qinv_;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_numerator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->number_of_pairs_denormenator_KTdiff_qinv_).
  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ran_gen_ptr_).super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->ran_gen_ptr_).
              super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(ran_gen->super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>).
              _M_refcount);
  this->long_comoving_boost = false;
  local_1e8 = &this->messager;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"long_comoving_boost","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    local_268 = dVar31;
    operator_delete(local_50._M_dataplus._M_p);
    dVar31 = local_268;
  }
  if ((dVar31 == 1.0) && (!NAN(dVar31))) {
    this->long_comoving_boost = true;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"qnpts","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_70);
  this->qnpts = (int)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"q_min","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_90);
  this->q_min = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"q_max","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_b0);
  this->q_max = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
    dVar31 = this->q_max;
  }
  this_03 = local_1f0;
  this_02 = local_1f8;
  pvVar23 = local_248;
  this->delta_q = (dVar31 - this->q_min) / (double)(this->qnpts + -1);
  if (0 < this->qnpts) {
    iVar24 = 0;
    do {
      local_268 = (double)iVar24;
      local_278 = this->delta_q * local_268 + this->q_min;
      iVar5._M_current =
           (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (this_03,iVar5,&local_278);
      }
      else {
        *iVar5._M_current = local_278;
        (this->q_out).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_278 = this->delta_q * local_268 + this->q_min;
      iVar5._M_current =
           (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (this_02,iVar5,&local_278);
      }
      else {
        *iVar5._M_current = local_278;
        (this->q_side).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_278 = local_268 * this->delta_q + this->q_min;
      iVar5._M_current =
           (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (local_260,iVar5,&local_278);
      }
      else {
        *iVar5._M_current = local_278;
        (this->q_long).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < this->qnpts);
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"needed_number_of_pairs","");
  this_01 = local_200;
  this_00 = local_208;
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_d0);
  this->needed_number_of_pairs =
       (long)(dVar31 - 9.223372036854776e+18) & (long)dVar31 >> 0x3f | (long)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"azimuthal_flag","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_f0);
  this->azimuthal_flag_ = (int)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"invariant_radius_flag","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_110);
  this->invariant_radius_flag_ = (int)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"n_KT","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_130);
  this->n_KT = (int)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"n_Kphi","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_150);
  this->n_Kphi = (int)dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"KT_min","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_170);
  this->KT_min = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p);
  }
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"KT_max","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_190);
  this->KT_max = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"HBTrap_min","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_1b0);
  this->Krap_min_ = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"HBTrap_max","");
  dVar31 = ParameterReader::getVal(&this->paraRdr_,&local_1d0);
  this->Krap_max_ = dVar31;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  auVar32._0_8_ = this->KT_max - this->KT_min;
  iVar24 = this->n_Kphi;
  auVar33._0_8_ = (double)(this->n_KT + -1);
  auVar33._8_8_ = (double)iVar24;
  auVar32._8_8_ = 0x401921fb54442d18;
  auVar32 = divpd(auVar32,auVar33);
  this->dKT = (double)auVar32._0_8_;
  this->dKphi = (double)auVar32._8_8_;
  if (0 < this->n_KT) {
    iVar24 = 0;
    do {
      local_278 = (double)iVar24 * this->dKT + this->KT_min;
      iVar5._M_current =
           (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar23,iVar5,&local_278);
      }
      else {
        *iVar5._M_current = local_278;
        (this->KT_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      local_278 = 0.0;
      iVar6._M_current =
           (this->number_of_pairs_numerator_KTdiff).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->number_of_pairs_numerator_KTdiff).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(this_01,iVar6,(unsigned_long_long *)&local_278);
      }
      else {
        *iVar6._M_current = 0;
        (this->number_of_pairs_numerator_KTdiff).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_278 = 0.0;
      iVar6._M_current =
           (this->number_of_pairs_denormenator_KTdiff).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->number_of_pairs_denormenator_KTdiff).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(this_00,iVar6,(unsigned_long_long *)&local_278);
      }
      else {
        *iVar6._M_current = 0;
        (this->number_of_pairs_denormenator_KTdiff).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_278 = 0.0;
      iVar6._M_current =
           (this->number_of_pairs_numerator_KTdiff_qinv_).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->number_of_pairs_numerator_KTdiff_qinv_).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(local_270,iVar6,(unsigned_long_long *)&local_278);
      }
      else {
        *iVar6._M_current = 0;
        (this->number_of_pairs_numerator_KTdiff_qinv_).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      local_278 = 0.0;
      iVar6._M_current =
           (this->number_of_pairs_denormenator_KTdiff_qinv_).
           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar6._M_current ==
          (this->number_of_pairs_denormenator_KTdiff_qinv_).
          super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::
        _M_realloc_insert<unsigned_long_long>(local_258,iVar6,(unsigned_long_long *)&local_278);
      }
      else {
        *iVar6._M_current = 0;
        (this->number_of_pairs_denormenator_KTdiff_qinv_).
        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar6._M_current + 1;
      }
      iVar24 = iVar24 + 1;
    } while (iVar24 < this->n_KT);
    iVar24 = this->n_Kphi;
  }
  pvVar23 = local_210;
  if (0 < iVar24) {
    iVar25 = 0;
    do {
      local_278 = (double)iVar25 * this->dKphi;
      iVar5._M_current =
           (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar5._M_current ==
          (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (pvVar23,iVar5,&local_278);
        iVar24 = this->n_Kphi;
      }
      else {
        *iVar5._M_current = local_278;
        (this->Kphi_array_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar5._M_current + 1;
      }
      iVar25 = iVar25 + 1;
    } while (iVar25 < iVar24);
  }
  if (this->azimuthal_flag_ == 1) {
    create_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_numerator_KTKphidiff,this->n_KT,iVar24);
    create_a_2D_array<unsigned_long_long>
              (this,&this->number_of_pairs_denormenator_KTKphidiff,this->n_KT,this->n_Kphi);
    iVar24 = this->n_KT;
    if (0 < (long)iVar24) {
      uVar2 = this->n_Kphi;
      ppuVar7 = this->number_of_pairs_numerator_KTKphidiff;
      ppuVar8 = this->number_of_pairs_denormenator_KTKphidiff;
      lVar26 = 0;
      do {
        if (0 < (int)uVar2) {
          puVar9 = ppuVar7[lVar26];
          puVar10 = ppuVar8[lVar26];
          uVar28 = 0;
          do {
            puVar9[uVar28] = 0;
            puVar10[uVar28] = 0;
            uVar28 = uVar28 + 1;
          } while (uVar2 != uVar28);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != iVar24);
    }
  }
  this->psi_ref = 0.0;
  this->number_pairs_num = 0;
  this->number_pairs_denorm = 0;
  if (this->invariant_radius_flag_ == 1) {
    create_a_2D_array<double>(this,&this->q_inv_mean,this->n_KT,this->qnpts);
    create_a_2D_array<double>(this,&this->correl_1d_inv_num,this->n_KT,this->qnpts);
    create_a_2D_array<double>(this,&this->correl_1d_inv_num_count,this->n_KT,this->qnpts);
    create_a_2D_array<double>(this,&this->correl_1d_inv_denorm,this->n_KT,this->qnpts);
    iVar24 = this->n_KT;
    if (0 < (long)iVar24) {
      uVar2 = this->qnpts;
      ppdVar11 = this->q_inv_mean;
      ppdVar12 = this->correl_1d_inv_num;
      ppdVar13 = this->correl_1d_inv_num_count;
      ppdVar14 = this->correl_1d_inv_denorm;
      lVar26 = 0;
      do {
        if (0 < (int)uVar2) {
          pdVar15 = ppdVar11[lVar26];
          pdVar16 = ppdVar12[lVar26];
          pdVar17 = ppdVar13[lVar26];
          pdVar18 = ppdVar14[lVar26];
          uVar28 = 0;
          do {
            pdVar15[uVar28] = 0.0;
            pdVar16[uVar28] = 0.0;
            pdVar17[uVar28] = 0.0;
            pdVar18[uVar28] = 0.0;
            uVar28 = uVar28 + 1;
          } while (uVar2 != uVar28);
        }
        lVar26 = lVar26 + 1;
      } while (lVar26 != iVar24);
    }
  }
  if (this->azimuthal_flag_ == 0) {
    local_250 = &this->q_out_mean;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,local_250,this->n_KT,iVar24,iVar24,iVar24);
    local_218 = (double ******)&this->q_side_mean;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,(double *****)local_218,this->n_KT,iVar24,iVar24,iVar24);
    local_220 = (double ******)&this->q_long_mean;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,(double *****)local_220,this->n_KT,iVar24,iVar24,iVar24);
    local_228 = (double ******)&this->correl_3d_num;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,(double *****)local_228,this->n_KT,iVar24,iVar24,iVar24);
    local_230 = (double ******)&this->correl_3d_num_count;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,(double *****)local_230,this->n_KT,iVar24,iVar24,iVar24);
    local_238 = (double ******)&this->correl_3d_denorm;
    iVar24 = this->qnpts;
    create_a_4D_array<double>(this,(double *****)local_238,this->n_KT,iVar24,iVar24,iVar24);
    iVar24 = this->n_KT;
    if (0 < (long)iVar24) {
      uVar2 = this->qnpts;
      uVar28 = (ulong)uVar2;
      local_270 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x0;
      do {
        if (0 < (int)uVar2) {
          uVar29 = 0;
          do {
            ppdVar11 = (*local_250)[(long)local_270][uVar29];
            ppdVar12 = (double **)(*local_218)[(long)local_270][uVar29];
            ppdVar13 = (double **)(*local_220)[(long)local_270][uVar29];
            ppdVar14 = (double **)(*local_228)[(long)local_270][uVar29];
            ppdVar19 = (double **)(*local_230)[(long)local_270][uVar29];
            ppdVar20 = (double **)(*local_238)[(long)local_270][uVar29];
            uVar30 = 0;
            do {
              pdVar15 = ppdVar11[uVar30];
              pdVar16 = ppdVar12[uVar30];
              pdVar17 = ppdVar13[uVar30];
              pdVar18 = ppdVar14[uVar30];
              pdVar21 = ppdVar19[uVar30];
              pdVar22 = ppdVar20[uVar30];
              uVar27 = 0;
              do {
                pdVar15[uVar27] = 0.0;
                pdVar16[uVar27] = 0.0;
                pdVar17[uVar27] = 0.0;
                pdVar18[uVar27] = 0.0;
                pdVar21[uVar27] = 0.0;
                pdVar22[uVar27] = 0.0;
                uVar27 = uVar27 + 1;
              } while (uVar28 != uVar27);
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar28);
            uVar29 = uVar29 + 1;
          } while (uVar29 != uVar28);
        }
        local_270 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                    ((long)local_270 + 1);
      } while (local_270 !=
               (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)(long)iVar24);
    }
  }
  else {
    local_218 = &this->q_out_diff_mean;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_218,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    local_220 = &this->q_side_diff_mean;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_220,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    local_228 = &this->q_long_diff_mean;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_228,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    local_230 = &this->correl_3d_Kphi_diff_num;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_230,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    local_238 = &this->correl_3d_Kphi_diff_num_count;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_238,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    local_240 = &this->correl_3d_Kphi_diff_denorm;
    iVar24 = this->qnpts;
    create_a_5D_array<double>(this,local_240,this->n_KT,this->n_Kphi,iVar24,iVar24,iVar24);
    iVar24 = this->n_KT;
    if (0 < (long)iVar24) {
      uVar2 = this->qnpts;
      uVar28 = (ulong)uVar2;
      uVar3 = this->n_Kphi;
      local_250 = (double *****)0x0;
      do {
        if (0 < (int)uVar3) {
          local_270 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x0;
          do {
            if (0 < (int)uVar2) {
              uVar29 = 0;
              do {
                ppdVar11 = (*local_218)[(long)local_250][(long)local_270][uVar29];
                ppdVar12 = (*local_220)[(long)local_250][(long)local_270][uVar29];
                ppdVar13 = (*local_228)[(long)local_250][(long)local_270][uVar29];
                ppdVar14 = (*local_230)[(long)local_250][(long)local_270][uVar29];
                ppdVar19 = (*local_238)[(long)local_250][(long)local_270][uVar29];
                ppdVar20 = (*local_240)[(long)local_250][(long)local_270][uVar29];
                uVar30 = 0;
                do {
                  pdVar15 = ppdVar11[uVar30];
                  pdVar16 = ppdVar12[uVar30];
                  pdVar17 = ppdVar13[uVar30];
                  pdVar18 = ppdVar14[uVar30];
                  pdVar21 = ppdVar19[uVar30];
                  pdVar22 = ppdVar20[uVar30];
                  uVar27 = 0;
                  do {
                    pdVar15[uVar27] = 0.0;
                    pdVar16[uVar27] = 0.0;
                    pdVar17[uVar27] = 0.0;
                    pdVar18[uVar27] = 0.0;
                    pdVar21[uVar27] = 0.0;
                    pdVar22[uVar27] = 0.0;
                    uVar27 = uVar27 + 1;
                  } while (uVar28 != uVar27);
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar28);
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar28);
            }
            local_270 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                        ((long)local_270 + 1);
          } while (local_270 !=
                   (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)(ulong)uVar3);
        }
        local_250 = (double *****)((long)local_250 + 1);
      } while (local_250 != (double *****)(long)iVar24);
    }
  }
  return;
}

Assistant:

HBT_correlation::HBT_correlation(
    ParameterReader &paraRdr, std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr_ = ran_gen;

    long_comoving_boost = false;
    if (paraRdr_.getVal("long_comoving_boost") == 1) long_comoving_boost = true;

    qnpts = paraRdr_.getVal("qnpts");
    q_min = paraRdr_.getVal("q_min");
    q_max = paraRdr_.getVal("q_max");
    delta_q = (q_max - q_min) / (qnpts - 1);

    for (int i = 0; i < qnpts; i++) {
        q_out.push_back(q_min + i * delta_q);
        q_side.push_back(q_min + i * delta_q);
        q_long.push_back(q_min + i * delta_q);
    }

    needed_number_of_pairs = paraRdr_.getVal("needed_number_of_pairs");

    azimuthal_flag_ = paraRdr_.getVal("azimuthal_flag");
    invariant_radius_flag_ = paraRdr_.getVal("invariant_radius_flag");

    n_KT = paraRdr_.getVal("n_KT");
    n_Kphi = paraRdr_.getVal("n_Kphi");
    KT_min = paraRdr_.getVal("KT_min");
    KT_max = paraRdr_.getVal("KT_max");
    Krap_min_ = paraRdr_.getVal("HBTrap_min");
    Krap_max_ = paraRdr_.getVal("HBTrap_max");

    dKT = (KT_max - KT_min) / (n_KT - 1);
    dKphi = 2 * M_PI / n_Kphi;  // does not need 0 and 2*pi

    for (int i = 0; i < n_KT; i++) {
        KT_array_.push_back(KT_min + i * dKT);
        number_of_pairs_numerator_KTdiff.push_back(0);
        number_of_pairs_denormenator_KTdiff.push_back(0);
        number_of_pairs_numerator_KTdiff_qinv_.push_back(0);
        number_of_pairs_denormenator_KTdiff_qinv_.push_back(0);
    }

    for (int i = 0; i < n_Kphi; i++) {
        Kphi_array_.push_back(i * dKphi);
    }

    if (azimuthal_flag_ == 1) {
        create_a_2D_array(number_of_pairs_numerator_KTKphidiff, n_KT, n_Kphi);
        create_a_2D_array(
            number_of_pairs_denormenator_KTKphidiff, n_KT, n_Kphi);
        for (int i = 0; i < n_KT; i++) {
            for (int j = 0; j < n_Kphi; j++) {
                number_of_pairs_numerator_KTKphidiff[i][j] = 0;
                number_of_pairs_denormenator_KTKphidiff[i][j] = 0;
            }
        }
    }

    number_pairs_num = 0;
    number_pairs_denorm = 0;
    psi_ref = 0.;

    if (invariant_radius_flag_ == 1) {
        create_a_2D_array(q_inv_mean, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num_count, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_denorm, n_KT, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int k = 0; k < qnpts; k++) {
                q_inv_mean[iK][k] = 0.0;
                correl_1d_inv_num[iK][k] = 0.0;
                correl_1d_inv_num_count[iK][k] = 0.0;
                correl_1d_inv_denorm[iK][k] = 0.0;
            }
        }
    }

    if (azimuthal_flag_ == 0) {
        create_a_4D_array(q_out_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_side_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_long_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num_count, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_denorm, n_KT, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int i = 0; i < qnpts; i++) {
                for (int j = 0; j < qnpts; j++) {
                    for (int k = 0; k < qnpts; k++) {
                        q_out_mean[iK][i][j][k] = 0.0;
                        q_side_mean[iK][i][j][k] = 0.0;
                        q_long_mean[iK][i][j][k] = 0.0;
                        correl_3d_num[iK][i][j][k] = 0.0;
                        correl_3d_num_count[iK][i][j][k] = 0.0;
                        correl_3d_denorm[iK][i][j][k] = 0.0;
                    }
                }
            }
        }
    } else {
        create_a_5D_array(q_out_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_side_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_long_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num_count, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_denorm, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int iphi = 0; iphi < n_Kphi; iphi++) {
                for (int i = 0; i < qnpts; i++) {
                    for (int j = 0; j < qnpts; j++) {
                        for (int k = 0; k < qnpts; k++) {
                            q_out_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_side_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_long_diff_mean[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num_count[iK][iphi][i][j][k] =
                                0.0;
                            correl_3d_Kphi_diff_denorm[iK][iphi][i][j][k] = 0.0;
                        }
                    }
                }
            }
        }
    }
}